

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_pagehandle.cc
# Opt level: O0

RC __thiscall PF_PageHandle::GetPageNum(PF_PageHandle *this,PageNum *_pageNum)

{
  PageNum *_pageNum_local;
  PF_PageHandle *this_local;
  
  if (this->pPageData == (char *)0x0) {
    this_local._4_4_ = 7;
  }
  else {
    *_pageNum = this->pageNum;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC PF_PageHandle::GetPageNum(PageNum &_pageNum) const
{

  // Page must refer to a pinned page
  if (pPageData == NULL)
    return (PF_PAGEUNPINNED);

  // Set page number
  _pageNum = this->pageNum;

  // Return ok
  return (0);
}